

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O0

bbox * get_quad_bbox(bbox *__return_storage_ptr__,void *primitive_data,size_t index)

{
  bbox a;
  bbox a_00;
  bbox a_01;
  bbox b;
  bbox b_00;
  bbox b_01;
  vec3 vVar1;
  undefined8 in_stack_fffffffffffffe98;
  bbox local_120;
  undefined8 local_108;
  real_t local_100;
  real_t local_f8 [3];
  undefined8 local_e8;
  real_t local_e0;
  bbox local_d8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  real_t local_a0;
  real_t local_98 [3];
  undefined8 local_88;
  real_t local_80;
  bbox local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  real_t local_40;
  bbox local_38;
  quad *local_20;
  quad *quad;
  size_t index_local;
  void *primitive_data_local;
  
  local_20 = (quad *)((long)primitive_data + index * 0x48);
  local_40 = (local_20->p0)._[2];
  local_48 = *(undefined8 *)(local_20->p0)._;
  quad = (quad *)index;
  index_local = (size_t)primitive_data;
  point_bbox(&local_38,(vec3)*&(local_20->p0)._);
  vVar1 = get_quad_p1(local_20);
  local_98[2] = vVar1._[2];
  local_80 = local_98[2];
  local_98._0_8_ = vVar1._._0_8_;
  local_88._0_4_ = local_98[0];
  local_88._4_4_ = local_98[1];
  local_a0 = local_98[2];
  local_a8._0_4_ = local_98[0];
  local_a8._4_4_ = local_98[1];
  local_98 = vVar1._;
  point_bbox(&local_78,vVar1);
  vVar1 = get_quad_p2(local_20);
  local_f8[2] = vVar1._[2];
  local_e0 = local_f8[2];
  local_f8._0_8_ = vVar1._._0_8_;
  local_e8._0_4_ = local_f8[0];
  local_e8._4_4_ = local_f8[1];
  local_100 = local_f8[2];
  local_108._0_4_ = local_f8[0];
  local_108._4_4_ = local_f8[1];
  local_f8 = vVar1._;
  point_bbox(&local_d8,vVar1);
  vVar1 = get_quad_p3(local_20);
  point_bbox(&local_120,vVar1);
  a.min._[2] = local_d8.max._[1];
  a.max._[0] = local_d8.max._[2];
  a.min._[0] = local_d8.min._[2];
  a.min._[1] = local_d8.max._[0];
  a.max._[1] = local_120.min._[0];
  a.max._[2] = local_120.min._[1];
  b.min._[2] = local_120.max._[1];
  b.max._[0] = local_120.max._[2];
  b.min._[0] = local_120.min._[2];
  b.min._[1] = local_120.max._[0];
  b.max._[1] = (real_t)(int)in_stack_fffffffffffffe98;
  b.max._[2] = (real_t)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  union_bbox(a,b);
  a_00.min._[2] = local_78.max._[1];
  a_00.max._[0] = local_78.max._[2];
  a_00.min._[0] = local_78.min._[2];
  a_00.min._[1] = local_78.max._[0];
  a_00.max._[1] = (real_t)(undefined4)local_c0;
  a_00.max._[2] = (real_t)local_c0._4_4_;
  b_00.min._[2] = (real_t)(undefined4)local_b0;
  b_00.max._[0] = (real_t)local_b0._4_4_;
  b_00.min._[0] = (real_t)(undefined4)local_b8;
  b_00.min._[1] = (real_t)local_b8._4_4_;
  b_00.max._[1] = (real_t)(int)in_stack_fffffffffffffe98;
  b_00.max._[2] = (real_t)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  union_bbox(a_00,b_00);
  a_01.min._[2] = local_38.max._[1];
  a_01.max._[0] = local_38.max._[2];
  a_01.min._[0] = local_38.min._[2];
  a_01.min._[1] = local_38.max._[0];
  a_01.max._[1] = (real_t)(undefined4)local_60;
  a_01.max._[2] = (real_t)local_60._4_4_;
  b_01.min._[2] = (real_t)(undefined4)local_50;
  b_01.max._[0] = (real_t)local_50._4_4_;
  b_01.min._[0] = (real_t)(undefined4)local_58;
  b_01.min._[1] = (real_t)local_58._4_4_;
  b_01.max._[1] = (real_t)(int)in_stack_fffffffffffffe98;
  b_01.max._[2] = (real_t)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  union_bbox(a_01,b_01);
  return __return_storage_ptr__;
}

Assistant:

static struct bbox get_quad_bbox(void* primitive_data, size_t index) {
    const struct quad* quad = &((const struct quad*)primitive_data)[index];
    return
        union_bbox(point_bbox(quad->p0),
        union_bbox(point_bbox(get_quad_p1(quad)),
        union_bbox(point_bbox(get_quad_p2(quad)),
            point_bbox(get_quad_p3(quad)))));
}